

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86func.cpp
# Opt level: O0

Error asmjit::v1_14::x86::FuncInternal::initCallConv
                (CallConv *cc,CallConvId ccId,Environment *environment)

{
  bool bVar1;
  Error EVar2;
  uchar *puVar3;
  ulong uVar4;
  undefined4 in_stack_fffffffffffff488;
  undefined4 in_stack_fffffffffffff48c;
  RegMask in_stack_fffffffffffff490;
  RegMask RVar5;
  undefined4 in_stack_fffffffffffff494;
  RegGroup RVar6;
  undefined4 in_stack_fffffffffffff498;
  undefined4 uVar7;
  undefined4 in_stack_fffffffffffff49c;
  CallConvId local_b42;
  undefined8 in_stack_fffffffffffff4d0;
  uint32_t uVar8;
  uint32_t in_stack_fffffffffffff4d8;
  undefined2 uVar9;
  uint uVar10;
  uint32_t a1;
  int iVar11;
  uint32_t a0;
  undefined1 local_b1c [3];
  RegGroup group;
  uint32_t n_1;
  undefined4 local_b14;
  undefined4 local_b10;
  undefined4 local_b0c;
  undefined4 local_b08;
  uint32_t n;
  undefined4 local_b00;
  bool isStandardCallConv;
  bool winABI;
  uint32_t kZdi;
  uint32_t kZsi;
  uint32_t kZbp;
  uint32_t kZsp;
  uint32_t kZdx;
  uint32_t kZcx;
  uint32_t kZbx;
  uint32_t kZax;
  Environment *environment_local;
  uint32_t in_stack_fffffffffffff530;
  CallConvId ccId_local;
  CallConv *cc_local;
  undefined4 local_9dc;
  undefined4 *local_9d8;
  undefined4 local_9cc;
  CallConv *local_9c8;
  undefined4 local_9bc;
  CallConv *local_9b8;
  undefined4 local_9ac;
  CallConv *local_9a8;
  undefined4 local_99c;
  CallConv *local_998;
  undefined4 local_98c;
  CallConv *local_988;
  undefined4 local_97c;
  CallConv *local_978;
  undefined4 local_96c;
  CallConv *local_968;
  undefined4 local_95c;
  CallConv *local_958;
  undefined4 local_94c;
  CallConv *local_948;
  undefined4 local_93c;
  CallConv *local_938;
  undefined4 local_92c;
  CallConv *local_928;
  undefined4 local_91c;
  CallConv *local_918;
  undefined4 local_90c;
  CallConv *local_908;
  undefined4 local_8fc;
  CallConv *local_8f8;
  undefined4 local_8ec;
  CallConv *local_8e8;
  undefined1 *local_8e0;
  undefined4 *local_8d8;
  undefined4 *local_8d0;
  uint32_t *local_8c8;
  uint32_t *local_8c0;
  undefined4 local_894;
  undefined4 local_890;
  undefined4 local_88c;
  undefined4 local_888;
  undefined4 local_884;
  undefined4 local_880;
  undefined4 local_87c;
  undefined4 local_878;
  undefined4 local_874;
  undefined4 local_870;
  undefined4 local_86c;
  undefined4 local_868;
  undefined4 local_864;
  CallConv *local_860;
  undefined4 local_858;
  undefined4 local_854;
  undefined4 local_850;
  undefined4 local_84c;
  undefined4 local_848;
  undefined4 local_844;
  uint32_t *local_840;
  undefined1 local_831;
  CallConv *local_830;
  undefined1 local_821;
  CallConv *local_820;
  undefined4 local_814;
  CallConv *local_810;
  undefined4 local_804;
  CallConv *local_800;
  undefined4 local_7f8;
  undefined4 local_7f4;
  undefined4 local_7f0;
  undefined4 local_7ec;
  undefined4 local_7e8;
  undefined4 local_7e4;
  undefined4 local_7e0;
  undefined4 local_7dc;
  uint32_t *local_7d8;
  undefined4 local_7d0;
  undefined4 local_7cc;
  undefined4 local_7c8;
  undefined4 local_7c4;
  undefined4 local_7c0;
  undefined4 local_7bc;
  undefined4 local_7b8;
  undefined4 local_7b4;
  uint32_t *local_7b0;
  undefined4 local_7a4;
  undefined4 local_7a0;
  undefined4 local_79c;
  undefined4 local_798;
  undefined4 local_794;
  undefined4 local_790;
  undefined4 local_78c;
  undefined4 local_788;
  undefined4 local_784;
  undefined4 *local_780;
  undefined4 local_774;
  undefined4 local_770;
  undefined4 local_76c;
  undefined4 local_768;
  undefined4 local_764;
  undefined4 local_760;
  undefined4 local_75c;
  undefined4 local_758;
  undefined4 local_754;
  undefined4 *local_750;
  Arch local_731;
  uint32_t *local_730;
  uint32_t *local_728;
  uint32_t *local_720;
  undefined4 *local_718;
  undefined4 local_70c;
  undefined4 local_708;
  undefined4 local_704;
  undefined4 *local_700;
  undefined4 *local_6f8;
  undefined4 *local_6f0;
  undefined4 *local_6e8;
  undefined4 local_6e0;
  undefined4 local_6dc;
  undefined4 *local_6d8;
  undefined4 *local_6d0;
  undefined4 *local_6c8;
  undefined4 local_6bc;
  undefined4 *local_6b8;
  undefined4 *local_6b0;
  undefined4 *local_6a8;
  undefined4 *local_6a0;
  undefined4 *local_698;
  undefined4 local_66c;
  undefined4 local_668;
  undefined4 local_664;
  undefined4 local_660;
  undefined4 local_65c;
  undefined4 *local_658;
  undefined4 *local_650;
  undefined4 local_648;
  undefined4 local_644;
  undefined4 local_640;
  undefined4 local_63c;
  undefined4 *local_638;
  undefined4 *local_630;
  undefined4 local_624;
  undefined4 local_620;
  undefined4 local_61c;
  undefined4 *local_618;
  undefined4 *local_610;
  undefined4 *local_608;
  undefined4 *local_600;
  undefined4 local_5f8;
  undefined4 local_5f4;
  undefined4 *local_5f0;
  undefined4 *local_5e8;
  undefined4 *local_5e0;
  undefined4 *local_5d8;
  undefined4 *local_5d0;
  undefined4 *local_5c8;
  undefined4 local_5bc;
  undefined4 *local_5b8;
  undefined4 *local_5b0;
  undefined4 *local_5a8;
  undefined4 *local_5a0;
  undefined4 *local_598;
  undefined4 local_58c;
  undefined4 local_588;
  undefined4 local_584;
  undefined4 local_580;
  undefined4 local_57c;
  undefined4 local_578;
  undefined4 local_574;
  undefined4 *local_570;
  undefined4 local_568;
  undefined4 local_564;
  undefined4 local_560;
  undefined4 local_55c;
  undefined4 local_558;
  undefined4 local_554;
  undefined4 *local_550;
  undefined4 *local_548;
  undefined4 *local_540;
  undefined4 local_534;
  undefined4 local_530;
  undefined4 local_52c;
  undefined4 local_528;
  undefined4 local_524;
  undefined4 *local_520;
  undefined4 *local_518;
  undefined4 local_510;
  undefined4 local_50c;
  undefined4 local_508;
  undefined4 local_504;
  undefined4 *local_500;
  undefined4 *local_4f8;
  undefined4 local_4ec;
  undefined4 local_4e8;
  undefined4 local_4e4;
  undefined4 *local_4e0;
  undefined4 *local_4d8;
  undefined4 local_4d0;
  undefined4 local_4cc;
  undefined4 *local_4c8;
  undefined4 *local_4c0;
  undefined4 *local_4b8;
  undefined4 *local_4b0;
  undefined4 local_4a4;
  undefined4 *local_4a0;
  undefined4 *local_498;
  undefined4 *local_490;
  undefined4 *local_488;
  undefined4 *local_480;
  undefined4 local_474;
  undefined4 local_470;
  undefined4 local_46c;
  undefined4 local_468;
  undefined4 local_464;
  undefined4 local_460;
  undefined4 local_45c;
  undefined4 *local_458;
  undefined4 local_450;
  undefined4 local_44c;
  undefined4 local_448;
  undefined4 local_444;
  undefined4 local_440;
  undefined4 local_43c;
  undefined4 *local_438;
  undefined4 *local_430;
  undefined4 *local_428;
  undefined4 local_41c;
  undefined4 local_418;
  undefined4 local_414;
  undefined4 local_410;
  undefined4 local_40c;
  undefined4 *local_408;
  undefined4 *local_400;
  undefined4 local_3f8;
  undefined4 local_3f4;
  undefined4 local_3f0;
  undefined4 local_3ec;
  undefined4 *local_3e8;
  undefined4 *local_3e0;
  undefined4 local_3d4;
  undefined4 local_3d0;
  undefined4 local_3cc;
  undefined4 *local_3c8;
  undefined4 *local_3c0;
  undefined4 local_3b8;
  undefined4 local_3b4;
  undefined4 *local_3b0;
  undefined4 *local_3a8;
  undefined4 *local_3a0;
  undefined4 *local_398;
  undefined4 local_38c;
  undefined4 *local_388;
  undefined4 *local_380;
  undefined4 *local_378;
  undefined4 *local_370;
  undefined4 *local_368;
  undefined4 local_360;
  undefined4 local_35c;
  undefined4 local_358;
  undefined4 local_354;
  undefined4 local_350;
  undefined4 local_34c;
  undefined4 local_348;
  undefined4 local_344;
  undefined4 *local_340;
  undefined4 *local_338;
  undefined4 *local_330;
  undefined4 local_328;
  undefined4 local_324;
  undefined4 local_320;
  undefined4 local_31c;
  undefined4 local_318;
  undefined4 local_314;
  undefined4 local_310;
  undefined4 local_30c;
  undefined4 *local_308;
  undefined4 *local_300;
  undefined4 *local_2f8;
  undefined4 local_2ec;
  undefined4 local_2e8;
  undefined4 local_2e4;
  undefined4 local_2e0;
  undefined4 local_2dc;
  undefined4 local_2d8;
  undefined4 local_2d4;
  undefined4 *local_2d0;
  undefined4 *local_2c8;
  undefined4 *local_2c0;
  undefined4 local_2b4;
  undefined4 local_2b0;
  undefined4 local_2ac;
  undefined4 local_2a8;
  undefined4 local_2a4;
  undefined4 local_2a0;
  undefined4 local_29c;
  undefined4 *local_298;
  undefined4 *local_290;
  undefined4 *local_288;
  undefined4 local_280;
  undefined4 local_27c;
  undefined4 local_278;
  undefined4 local_274;
  undefined4 local_270;
  undefined4 local_26c;
  undefined4 *local_268;
  undefined4 *local_260;
  undefined4 *local_258;
  undefined4 local_250;
  undefined4 local_24c;
  undefined4 local_248;
  undefined4 local_244;
  undefined4 local_240;
  undefined4 local_23c;
  undefined4 *local_238;
  undefined4 *local_230;
  undefined4 *local_228;
  undefined4 local_21c;
  undefined4 local_218;
  undefined4 local_214;
  undefined4 local_210;
  undefined4 local_20c;
  undefined4 *local_208;
  undefined4 *local_200;
  undefined4 *local_1f8;
  undefined4 local_1ec;
  undefined4 local_1e8;
  undefined4 local_1e4;
  undefined4 local_1e0;
  undefined4 local_1dc;
  undefined4 *local_1d8;
  undefined4 *local_1d0;
  undefined4 *local_1c8;
  undefined4 local_1c0;
  undefined4 local_1bc;
  undefined4 local_1b8;
  undefined4 local_1b4;
  undefined4 *local_1b0;
  undefined4 local_1a4;
  undefined4 local_1a0;
  undefined4 local_19c;
  undefined4 *local_198;
  undefined4 *local_190;
  undefined4 *local_188;
  undefined4 local_180;
  undefined4 local_17c;
  undefined4 *local_178;
  undefined4 *local_170;
  undefined4 *local_168;
  undefined4 *local_160;
  undefined4 *local_158;
  undefined4 local_14c;
  undefined4 *local_148;
  undefined4 *local_140;
  undefined4 *local_138;
  undefined4 *local_130;
  undefined4 *local_128;
  undefined4 local_120;
  undefined4 local_11c;
  undefined4 local_118;
  undefined4 local_114;
  undefined4 *local_110;
  undefined4 local_104;
  undefined4 local_100;
  undefined4 local_fc;
  undefined4 *local_f8;
  undefined4 *local_f0;
  undefined4 *local_e8;
  undefined4 local_e0;
  undefined4 local_dc;
  undefined4 *local_d8;
  undefined4 *local_d0;
  undefined4 *local_c8;
  undefined4 *local_c0;
  undefined4 *local_b8;
  undefined4 local_ac;
  undefined4 *local_a8;
  undefined4 *local_a0;
  undefined4 *local_98;
  undefined4 *local_90;
  undefined4 *local_88;
  undefined4 *local_80;
  undefined4 *local_78;
  undefined4 *local_70;
  undefined4 *local_68;
  undefined4 *local_60;
  undefined4 *local_58;
  undefined4 *local_50;
  undefined4 *local_48;
  undefined4 *local_40;
  undefined4 *local_38;
  uint32_t *local_30;
  uint32_t *local_28;
  uint32_t *local_20;
  
  group = (RegGroup)((uint)_local_b1c >> 0x18);
  uVar8 = (uint32_t)((ulong)in_stack_fffffffffffff4d0 >> 0x20);
  kZax = 0;
  kZbx = 3;
  kZcx = 1;
  kZdx = 2;
  kZsp = 4;
  kZbp = 5;
  kZsi = 6;
  kZdi = 7;
  iVar11 = 0x1000000;
  if (environment->_platform != kWindows) {
    iVar11 = (uint)(environment->_platformABI == kMSVC) << 0x18;
  }
  winABI = SUB41((uint)iVar11 >> 0x18,0);
  cc->_arch = environment->_arch;
  uVar9 = 0x10;
  environment_local = environment;
  puVar3 = Support::Array<unsigned_char,_4UL>::operator[]<asmjit::v1_14::RegGroup>
                     ((Array<unsigned_char,_4UL> *)
                      CONCAT44(in_stack_fffffffffffff494,in_stack_fffffffffffff490),
                      (RegGroup *)CONCAT44(in_stack_fffffffffffff48c,in_stack_fffffffffffff488));
  *puVar3 = (uchar)((ushort)uVar9 >> 8);
  uVar10 = (uint)CONCAT12(8,uVar9);
  puVar3 = Support::Array<unsigned_char,_4UL>::operator[]<asmjit::v1_14::RegGroup>
                     ((Array<unsigned_char,_4UL> *)
                      CONCAT44(in_stack_fffffffffffff494,in_stack_fffffffffffff490),
                      (RegGroup *)CONCAT44(in_stack_fffffffffffff48c,in_stack_fffffffffffff488));
  *puVar3 = (uchar)(uVar10 >> 0x10);
  a1 = CONCAT13(8,(int3)uVar10);
  puVar3 = Support::Array<unsigned_char,_4UL>::operator[]<asmjit::v1_14::RegGroup>
                     ((Array<unsigned_char,_4UL> *)
                      CONCAT44(in_stack_fffffffffffff494,in_stack_fffffffffffff490),
                      (RegGroup *)CONCAT44(in_stack_fffffffffffff48c,in_stack_fffffffffffff488));
  *puVar3 = (uchar)(a1 >> 0x18);
  uVar7 = CONCAT31((int3)((uint)iVar11 >> 8),0x10);
  puVar3 = Support::Array<unsigned_char,_4UL>::operator[]<asmjit::v1_14::RegGroup>
                     ((Array<unsigned_char,_4UL> *)
                      CONCAT44(in_stack_fffffffffffff494,in_stack_fffffffffffff490),
                      (RegGroup *)CONCAT44(in_stack_fffffffffffff48c,in_stack_fffffffffffff488));
  *puVar3 = (uchar)uVar7;
  uVar7 = CONCAT22((short)((uint)uVar7 >> 0x10),CONCAT11(8,(uchar)uVar7));
  puVar3 = Support::Array<unsigned_char,_4UL>::operator[]<asmjit::v1_14::RegGroup>
                     ((Array<unsigned_char,_4UL> *)
                      CONCAT44(in_stack_fffffffffffff494,in_stack_fffffffffffff490),
                      (RegGroup *)CONCAT44(in_stack_fffffffffffff48c,in_stack_fffffffffffff488));
  *puVar3 = (uchar)((uint)uVar7 >> 8);
  a0 = CONCAT13((char)((uint)uVar7 >> 0x18),CONCAT12(8,(short)uVar7));
  puVar3 = Support::Array<unsigned_char,_4UL>::operator[]<asmjit::v1_14::RegGroup>
                     ((Array<unsigned_char,_4UL> *)
                      CONCAT44(in_stack_fffffffffffff494,in_stack_fffffffffffff490),
                      (RegGroup *)CONCAT44(in_stack_fffffffffffff48c,in_stack_fffffffffffff488));
  *puVar3 = (uchar)(a0 >> 0x10);
  local_731 = environment_local->_arch;
  cc_local._0_4_ = (uint32_t)cc;
  ccId_local = ccId;
  if ((local_731 & k32BitMask) == k32BitMask) {
    isStandardCallConv = true;
    uVar7 = 4;
    puVar3 = Support::Array<unsigned_char,_4UL>::operator[]<asmjit::v1_14::RegGroup>
                       ((Array<unsigned_char,_4UL> *)
                        CONCAT44(in_stack_fffffffffffff494,in_stack_fffffffffffff490),
                        (RegGroup *)CONCAT44(in_stack_fffffffffffff48c,in_stack_fffffffffffff488));
    *puVar3 = '\x04';
    puVar3 = Support::Array<unsigned_char,_4UL>::operator[]<asmjit::v1_14::RegGroup>
                       ((Array<unsigned_char,_4UL> *)
                        CONCAT44(in_stack_fffffffffffff494,in_stack_fffffffffffff490),
                        (RegGroup *)CONCAT44(in_stack_fffffffffffff48c,in_stack_fffffffffffff488));
    *puVar3 = '\x04';
    local_b00 = 3;
    local_9d8 = &local_b00;
    local_700 = &local_9dc;
    local_704 = 5;
    local_708 = 6;
    local_70c = 7;
    local_6d8 = &local_704;
    local_6dc = 6;
    local_6e0 = 7;
    local_6b8 = &local_6dc;
    local_6bc = 7;
    local_6b0 = &local_6bc;
    RVar6 = (RegGroup)((uint)in_stack_fffffffffffff494 >> 0x18);
    local_9dc = uVar7;
    local_718 = local_9d8;
    local_6f8 = local_700;
    local_6f0 = local_700;
    local_6e8 = local_9d8;
    local_6d0 = local_6d8;
    local_6c8 = local_6d8;
    local_6a8 = local_6b8;
    local_6a0 = local_6b8;
    local_698 = local_6b0;
    CallConv::setPreservedRegs
              ((CallConv *)CONCAT44(in_stack_fffffffffffff49c,in_stack_fffffffffffff498),RVar6,
               in_stack_fffffffffffff490);
    local_97c = 4;
    cc->_naturalStackAlignment = '\x04';
    uVar4 = (ulong)ccId;
    local_978 = cc;
    switch(uVar4) {
    case 0:
      break;
    case 1:
      local_8ec = 1;
      cc->_flags = kCalleePopsStack;
      local_97c = uVar7;
      local_8e8 = cc;
      break;
    case 2:
      local_8fc = 1;
      cc->_flags = kCalleePopsStack;
      local_97c = uVar7;
      local_8f8 = cc;
      CallConv::setPassedOrder
                ((CallConv *)CONCAT44(local_b14,n_1),group,a0,a1,in_stack_fffffffffffff4d8,0,kZbx,
                 (uint32_t)environment_local,in_stack_fffffffffffff530,(uint32_t)cc_local);
      break;
    case 3:
      local_90c = 1;
      cc->_flags = kCalleePopsStack;
      local_97c = uVar7;
      local_908 = cc;
      CallConv::setPassedOrder
                ((CallConv *)CONCAT44(local_b14,n_1),group,a0,a1,in_stack_fffffffffffff4d8,0,kZbx,
                 (uint32_t)environment_local,in_stack_fffffffffffff530,(uint32_t)cc_local);
      CallConv::setPassedOrder
                ((CallConv *)CONCAT44(local_b14,n_1),group,a0,a1,in_stack_fffffffffffff4d8,
                 (uint32_t)(uVar4 >> 0x20),kZbx,(uint32_t)environment_local,
                 in_stack_fffffffffffff530,(uint32_t)cc_local);
      break;
    case 4:
      if ((winABI & 1U) == 0) {
        ccId_local = kCDecl;
        local_97c = uVar7;
      }
      else {
        local_91c = 1;
        cc->_flags = kCalleePopsStack;
        local_97c = uVar7;
        local_918 = cc;
        CallConv::setPassedOrder
                  ((CallConv *)CONCAT44(local_b14,n_1),group,a0,a1,in_stack_fffffffffffff4d8,0,kZbx,
                   (uint32_t)environment_local,in_stack_fffffffffffff530,(uint32_t)cc_local);
      }
      break;
    case 5:
      local_97c = uVar7;
      CallConv::setPassedOrder
                ((CallConv *)CONCAT44(local_b14,n_1),group,a0,a1,in_stack_fffffffffffff4d8,0,kZbx,
                 (uint32_t)environment_local,in_stack_fffffffffffff530,(uint32_t)cc_local);
      break;
    case 6:
      local_97c = uVar7;
      CallConv::setPassedOrder
                ((CallConv *)CONCAT44(local_b14,n_1),group,a0,a1,in_stack_fffffffffffff4d8,0,kZbx,
                 (uint32_t)environment_local,in_stack_fffffffffffff530,(uint32_t)cc_local);
      break;
    case 7:
      local_97c = uVar7;
      CallConv::setPassedOrder
                ((CallConv *)CONCAT44(local_b14,n_1),group,a0,a1,in_stack_fffffffffffff4d8,0,kZbx,
                 (uint32_t)environment_local,in_stack_fffffffffffff530,(uint32_t)cc_local);
      break;
    default:
      local_97c = uVar7;
      EVar2 = DebugUtils::errored(2);
      return EVar2;
    case 0x10:
    case 0x11:
    case 0x12:
      n = ccId - 0xe;
      local_92c = 4;
      cc->_flags = kPassFloatsByVec;
      local_97c = uVar7;
      local_928 = cc;
      CallConv::setPassedOrder
                ((CallConv *)CONCAT44(local_b14,n_1),group,a0,a1,in_stack_fffffffffffff4d8,0,kZbx,
                 (uint32_t)environment_local,in_stack_fffffffffffff530,(uint32_t)cc_local);
      CallConv::setPassedOrder
                ((CallConv *)CONCAT44(local_b14,n_1),group,a0,a1,in_stack_fffffffffffff4d8,
                 (uint32_t)(uVar4 >> 0x20),kZbx,(uint32_t)environment_local,
                 in_stack_fffffffffffff530,(uint32_t)cc_local);
      CallConv::setPassedOrder
                ((CallConv *)CONCAT44(local_b14,n_1),group,a0,a1,in_stack_fffffffffffff4d8,
                 (uint32_t)(uVar4 >> 0x20),kZbx,(uint32_t)environment_local,
                 in_stack_fffffffffffff530,(uint32_t)cc_local);
      RVar5 = 5;
      uVar7 = 6;
      CallConv::setPassedOrder
                ((CallConv *)CONCAT44(local_b14,n_1),group,a0,a1,in_stack_fffffffffffff4d8,
                 (uint32_t)(uVar4 >> 0x20),kZbx,(uint32_t)environment_local,
                 in_stack_fffffffffffff530,(uint32_t)cc_local);
      local_b08 = 8;
      local_8d0 = &local_b08;
      CallConv::setPreservedRegs((CallConv *)CONCAT44(in_stack_fffffffffffff49c,uVar7),RVar6,RVar5);
      local_b0c = 8;
      local_8d8 = &local_b0c;
      local_8c0 = &n;
      CallConv::setPreservedRegs((CallConv *)CONCAT44(in_stack_fffffffffffff49c,uVar7),RVar6,RVar5);
      local_98c = 0x10;
      cc->_naturalStackAlignment = '\x10';
      isStandardCallConv = false;
      local_988 = cc;
    }
    uVar8 = (uint32_t)(uVar4 >> 0x20);
    if ((isStandardCallConv & 1U) != 0) {
      CallConv::setPassedOrder
                ((CallConv *)CONCAT44(local_b14,n_1),group,a0,a1,in_stack_fffffffffffff4d8,uVar8,
                 kZbx,(uint32_t)environment_local,in_stack_fffffffffffff530,(uint32_t)cc_local);
      CallConv::setPassedOrder
                ((CallConv *)CONCAT44(local_b14,n_1),group,a0,a1,in_stack_fffffffffffff4d8,uVar8,
                 kZbx,(uint32_t)environment_local,in_stack_fffffffffffff530,(uint32_t)cc_local);
      cc->_flags = cc->_flags | kPassVecByStackIfVA;
    }
    if (ccId_local == kCDecl) {
      cc->_flags = cc->_flags | kVarArgCompatible;
    }
  }
  else {
    puVar3 = Support::Array<unsigned_char,_4UL>::operator[]<asmjit::v1_14::RegGroup>
                       ((Array<unsigned_char,_4UL> *)
                        CONCAT44(in_stack_fffffffffffff494,in_stack_fffffffffffff490),
                        (RegGroup *)CONCAT44(in_stack_fffffffffffff48c,in_stack_fffffffffffff488));
    *puVar3 = '\b';
    puVar3 = Support::Array<unsigned_char,_4UL>::operator[]<asmjit::v1_14::RegGroup>
                       ((Array<unsigned_char,_4UL> *)
                        CONCAT44(in_stack_fffffffffffff494,in_stack_fffffffffffff490),
                        (RegGroup *)CONCAT44(in_stack_fffffffffffff48c,in_stack_fffffffffffff488));
    RVar6 = (RegGroup)((uint)in_stack_fffffffffffff494 >> 0x18);
    *puVar3 = '\b';
    bVar1 = shouldTreatAsCDeclIn64BitMode(ccId);
    if (bVar1) {
      local_b42 = kMaxValue;
      if ((winABI & 1U) == 0) {
        local_b42 = kX64SystemV;
      }
      ccId_local = local_b42;
    }
    if (ccId_local == kVectorCall) {
      local_831 = 2;
      cc->_strategy = kMaxValue;
      local_890 = 4;
      local_894 = 0x10;
      local_95c = 0x14;
      cc->_flags = kPassMmxByGp|kPassFloatsByVec;
      local_9bc = 0x10;
      cc->_naturalStackAlignment = '\x10';
      local_814 = 0x30;
      cc->_spillZoneSize = '0';
      local_9b8 = cc;
      local_958 = cc;
      local_830 = cc;
      local_810 = cc;
      CallConv::setPassedOrder
                ((CallConv *)CONCAT44(local_b14,n_1),group,a0,a1,in_stack_fffffffffffff4d8,uVar8,
                 kZbx,(uint32_t)environment_local,in_stack_fffffffffffff530,(uint32_t)cc_local);
      RVar5 = 5;
      uVar7 = 0xff;
      CallConv::setPassedOrder
                ((CallConv *)CONCAT44(local_b14,n_1),group,a0,a1,in_stack_fffffffffffff4d8,uVar8,
                 kZbx,(uint32_t)environment_local,in_stack_fffffffffffff530,(uint32_t)cc_local);
      local_7d8 = &kZbx;
      local_7dc = 4;
      local_7e0 = 5;
      local_7e4 = 6;
      local_7e8 = 7;
      local_7ec = 0xc;
      local_7f0 = 0xd;
      local_7f4 = 0xe;
      local_7f8 = 0xf;
      local_458 = &local_7dc;
      local_45c = 5;
      local_460 = 6;
      local_464 = 7;
      local_468 = 0xc;
      local_46c = 0xd;
      local_470 = 0xe;
      local_474 = 0xf;
      local_438 = &local_45c;
      local_43c = 6;
      local_440 = 7;
      local_444 = 0xc;
      local_448 = 0xd;
      local_44c = 0xe;
      local_450 = 0xf;
      local_408 = &local_43c;
      local_40c = 7;
      local_410 = 0xc;
      local_414 = 0xd;
      local_418 = 0xe;
      local_41c = 0xf;
      local_3e8 = &local_40c;
      local_3ec = 0xc;
      local_3f0 = 0xd;
      local_3f4 = 0xe;
      local_3f8 = 0xf;
      local_3c8 = &local_3ec;
      local_3cc = 0xd;
      local_3d0 = 0xe;
      local_3d4 = 0xf;
      local_3b0 = &local_3cc;
      local_3b4 = 0xe;
      local_3b8 = 0xf;
      local_388 = &local_3b4;
      local_38c = 0xf;
      local_380 = &local_38c;
      local_728 = local_7d8;
      local_430 = local_438;
      local_428 = local_458;
      local_400 = local_408;
      local_3e0 = local_3e8;
      local_3c0 = local_3c8;
      local_3a8 = local_3b0;
      local_3a0 = local_3b0;
      local_398 = local_3c8;
      local_378 = local_388;
      local_370 = local_388;
      local_368 = local_380;
      local_80 = local_3e8;
      local_78 = local_408;
      local_70 = local_438;
      local_68 = local_458;
      local_28 = local_7d8;
      CallConv::setPreservedRegs((CallConv *)CONCAT44(in_stack_fffffffffffff49c,uVar7),RVar6,RVar5);
      local_b14 = 6;
      local_780 = &local_b14;
      local_784 = 7;
      local_788 = 8;
      local_78c = 9;
      local_790 = 10;
      local_794 = 0xb;
      local_798 = 0xc;
      local_79c = 0xd;
      local_7a0 = 0xe;
      local_7a4 = 0xf;
      local_308 = &local_784;
      local_30c = 8;
      local_310 = 9;
      local_314 = 10;
      local_318 = 0xb;
      local_31c = 0xc;
      local_320 = 0xd;
      local_324 = 0xe;
      local_328 = 0xf;
      local_2d0 = &local_30c;
      local_2d4 = 9;
      local_2d8 = 10;
      local_2dc = 0xb;
      local_2e0 = 0xc;
      local_2e4 = 0xd;
      local_2e8 = 0xe;
      local_2ec = 0xf;
      local_238 = &local_2d4;
      local_23c = 10;
      local_240 = 0xb;
      local_244 = 0xc;
      local_248 = 0xd;
      local_24c = 0xe;
      local_250 = 0xf;
      local_208 = &local_23c;
      local_20c = 0xb;
      local_210 = 0xc;
      local_214 = 0xd;
      local_218 = 0xe;
      local_21c = 0xf;
      local_110 = &local_20c;
      local_114 = 0xc;
      local_118 = 0xd;
      local_11c = 0xe;
      local_120 = 0xf;
      local_f8 = &local_114;
      local_fc = 0xd;
      local_100 = 0xe;
      local_104 = 0xf;
      local_d8 = &local_fc;
      local_dc = 0xe;
      local_e0 = 0xf;
      local_a8 = &local_dc;
      local_ac = 0xf;
      local_a0 = &local_ac;
      local_600 = local_780;
      local_5d8 = local_780;
      local_300 = local_308;
      local_2f8 = local_308;
      local_2c8 = local_2d0;
      local_2c0 = local_2d0;
      local_230 = local_238;
      local_228 = local_238;
      local_200 = local_208;
      local_1f8 = local_208;
      local_f0 = local_f8;
      local_e8 = local_110;
      local_d0 = local_d8;
      local_c8 = local_d8;
      local_c0 = local_110;
      local_b8 = local_f8;
      local_98 = local_a8;
      local_90 = local_a8;
      local_88 = local_a0;
      CallConv::setPreservedRegs((CallConv *)CONCAT44(in_stack_fffffffffffff49c,uVar7),RVar6,RVar5);
    }
    else if ((byte)(ccId_local - kLightCall2) < 3) {
      n_1 = ccId_local - 0xe;
      local_96c = 4;
      cc->_flags = kPassFloatsByVec;
      local_9cc = 0x10;
      cc->_naturalStackAlignment = '\x10';
      local_9c8 = cc;
      local_968 = cc;
      CallConv::setPassedOrder
                ((CallConv *)CONCAT44(local_b14,n_1),group,a0,a1,in_stack_fffffffffffff4d8,uVar8,
                 kZbx,(uint32_t)environment_local,in_stack_fffffffffffff530,(uint32_t)cc_local);
      CallConv::setPassedOrder
                ((CallConv *)CONCAT44(local_b14,n_1),group,a0,a1,in_stack_fffffffffffff4d8,uVar8,
                 kZbx,(uint32_t)environment_local,in_stack_fffffffffffff530,(uint32_t)cc_local);
      CallConv::setPassedOrder
                ((CallConv *)CONCAT44(local_b14,n_1),group,a0,a1,in_stack_fffffffffffff4d8,uVar8,
                 kZbx,(uint32_t)environment_local,in_stack_fffffffffffff530,(uint32_t)cc_local);
      RVar5 = 5;
      uVar7 = 6;
      CallConv::setPassedOrder
                ((CallConv *)CONCAT44(local_b14,n_1),group,a0,a1,in_stack_fffffffffffff4d8,uVar8,
                 kZbx,(uint32_t)environment_local,in_stack_fffffffffffff530,(uint32_t)cc_local);
      _local_b1c = 0x10;
      local_8e0 = local_b1c;
      CallConv::setPreservedRegs((CallConv *)CONCAT44(in_stack_fffffffffffff49c,uVar7),RVar6,RVar5);
      local_8c8 = &n_1;
      CallConv::setPreservedRegs((CallConv *)CONCAT44(in_stack_fffffffffffff49c,uVar7),RVar6,RVar5);
    }
    else if (ccId_local == kX64SystemV) {
      local_868 = 4;
      local_86c = 0x20;
      local_870 = 0x24;
      local_874 = 0x80;
      local_93c = 0xa4;
      cc->_flags = kVarArgCompatible|kPassMmxByXmm|kPassFloatsByVec;
      local_99c = 0x10;
      cc->_naturalStackAlignment = '\x10';
      local_864 = 0x80;
      cc->_redZoneSize = 0x80;
      local_998 = cc;
      local_938 = cc;
      local_860 = cc;
      CallConv::setPassedOrder
                ((CallConv *)CONCAT44(local_b14,n_1),group,a0,a1,in_stack_fffffffffffff4d8,uVar8,
                 kZbx,(uint32_t)environment_local,in_stack_fffffffffffff530,(uint32_t)cc_local);
      RVar5 = 5;
      uVar7 = 6;
      CallConv::setPassedOrder
                ((CallConv *)CONCAT44(local_b14,n_1),group,a0,a1,in_stack_fffffffffffff4d8,uVar8,
                 kZbx,(uint32_t)environment_local,in_stack_fffffffffffff530,(uint32_t)cc_local);
      local_840 = &kZbx;
      local_844 = 4;
      local_848 = 5;
      local_84c = 0xc;
      local_850 = 0xd;
      local_854 = 0xe;
      local_858 = 0xf;
      local_658 = &local_844;
      local_65c = 5;
      local_660 = 0xc;
      local_664 = 0xd;
      local_668 = 0xe;
      local_66c = 0xf;
      local_638 = &local_65c;
      local_63c = 0xc;
      local_640 = 0xd;
      local_644 = 0xe;
      local_648 = 0xf;
      local_618 = &local_63c;
      local_61c = 0xd;
      local_620 = 0xe;
      local_624 = 0xf;
      local_5f0 = &local_61c;
      local_5f4 = 0xe;
      local_5f8 = 0xf;
      local_5b8 = &local_5f4;
      local_5bc = 0xf;
      local_5b0 = &local_5bc;
      local_720 = local_840;
      local_650 = local_658;
      local_630 = local_638;
      local_610 = local_618;
      local_5e8 = local_5f0;
      local_5e0 = local_5f0;
      local_5c8 = local_618;
      local_5a8 = local_5b8;
      local_5a0 = local_5b8;
      local_598 = local_5b0;
      local_40 = local_638;
      local_38 = local_658;
      local_30 = local_840;
      CallConv::setPreservedRegs((CallConv *)CONCAT44(in_stack_fffffffffffff49c,uVar7),RVar6,RVar5);
    }
    else {
      if (ccId_local != kMaxValue) {
        EVar2 = DebugUtils::errored(2);
        return EVar2;
      }
      local_821 = 1;
      cc->_strategy = kX64Windows;
      local_878 = 4;
      local_87c = 2;
      local_880 = 6;
      local_884 = 0x10;
      local_888 = 0x16;
      local_88c = 0x80;
      local_94c = 0x96;
      cc->_flags = kVarArgCompatible|kPassMmxByGp|kPassFloatsByVec|kIndirectVecArgs;
      local_9ac = 0x10;
      cc->_naturalStackAlignment = '\x10';
      local_804 = 0x20;
      cc->_spillZoneSize = ' ';
      local_9a8 = cc;
      local_948 = cc;
      local_820 = cc;
      local_800 = cc;
      CallConv::setPassedOrder
                ((CallConv *)CONCAT44(local_b14,n_1),group,a0,a1,in_stack_fffffffffffff4d8,uVar8,
                 kZbx,(uint32_t)environment_local,in_stack_fffffffffffff530,(uint32_t)cc_local);
      RVar5 = 0xff;
      uVar7 = 0xff;
      CallConv::setPassedOrder
                ((CallConv *)CONCAT44(local_b14,n_1),group,a0,a1,in_stack_fffffffffffff4d8,uVar8,
                 kZbx,(uint32_t)environment_local,in_stack_fffffffffffff530,(uint32_t)cc_local);
      local_7b0 = &kZbx;
      local_7b4 = 4;
      local_7b8 = 5;
      local_7bc = 6;
      local_7c0 = 7;
      local_7c4 = 0xc;
      local_7c8 = 0xd;
      local_7cc = 0xe;
      local_7d0 = 0xf;
      local_570 = &local_7b4;
      local_574 = 5;
      local_578 = 6;
      local_57c = 7;
      local_580 = 0xc;
      local_584 = 0xd;
      local_588 = 0xe;
      local_58c = 0xf;
      local_550 = &local_574;
      local_554 = 6;
      local_558 = 7;
      local_55c = 0xc;
      local_560 = 0xd;
      local_564 = 0xe;
      local_568 = 0xf;
      local_520 = &local_554;
      local_524 = 7;
      local_528 = 0xc;
      local_52c = 0xd;
      local_530 = 0xe;
      local_534 = 0xf;
      local_500 = &local_524;
      local_504 = 0xc;
      local_508 = 0xd;
      local_50c = 0xe;
      local_510 = 0xf;
      local_4e0 = &local_504;
      local_4e4 = 0xd;
      local_4e8 = 0xe;
      local_4ec = 0xf;
      local_4c8 = &local_4e4;
      local_4cc = 0xe;
      local_4d0 = 0xf;
      local_4a0 = &local_4cc;
      local_4a4 = 0xf;
      local_498 = &local_4a4;
      local_730 = local_7b0;
      local_548 = local_550;
      local_540 = local_570;
      local_518 = local_520;
      local_4f8 = local_500;
      local_4d8 = local_4e0;
      local_4c0 = local_4c8;
      local_4b8 = local_4c8;
      local_4b0 = local_4e0;
      local_490 = local_4a0;
      local_488 = local_4a0;
      local_480 = local_498;
      local_60 = local_500;
      local_58 = local_520;
      local_50 = local_550;
      local_48 = local_570;
      local_20 = local_7b0;
      CallConv::setPreservedRegs((CallConv *)CONCAT44(in_stack_fffffffffffff49c,uVar7),RVar6,RVar5);
      local_b10 = 6;
      local_750 = &local_b10;
      local_754 = 7;
      local_758 = 8;
      local_75c = 9;
      local_760 = 10;
      local_764 = 0xb;
      local_768 = 0xc;
      local_76c = 0xd;
      local_770 = 0xe;
      local_774 = 0xf;
      local_340 = &local_754;
      local_344 = 8;
      local_348 = 9;
      local_34c = 10;
      local_350 = 0xb;
      local_354 = 0xc;
      local_358 = 0xd;
      local_35c = 0xe;
      local_360 = 0xf;
      local_298 = &local_344;
      local_29c = 9;
      local_2a0 = 10;
      local_2a4 = 0xb;
      local_2a8 = 0xc;
      local_2ac = 0xd;
      local_2b0 = 0xe;
      local_2b4 = 0xf;
      local_268 = &local_29c;
      local_26c = 10;
      local_270 = 0xb;
      local_274 = 0xc;
      local_278 = 0xd;
      local_27c = 0xe;
      local_280 = 0xf;
      local_1d8 = &local_26c;
      local_1dc = 0xb;
      local_1e0 = 0xc;
      local_1e4 = 0xd;
      local_1e8 = 0xe;
      local_1ec = 0xf;
      local_1b0 = &local_1dc;
      local_1b4 = 0xc;
      local_1b8 = 0xd;
      local_1bc = 0xe;
      local_1c0 = 0xf;
      local_198 = &local_1b4;
      local_19c = 0xd;
      local_1a0 = 0xe;
      local_1a4 = 0xf;
      local_178 = &local_19c;
      local_17c = 0xe;
      local_180 = 0xf;
      local_148 = &local_17c;
      local_14c = 0xf;
      local_140 = &local_14c;
      local_608 = local_750;
      local_5d0 = local_750;
      local_338 = local_340;
      local_330 = local_340;
      local_290 = local_298;
      local_288 = local_298;
      local_260 = local_268;
      local_258 = local_268;
      local_1d0 = local_1d8;
      local_1c8 = local_1d8;
      local_190 = local_198;
      local_188 = local_1b0;
      local_170 = local_178;
      local_168 = local_178;
      local_160 = local_1b0;
      local_158 = local_198;
      local_138 = local_148;
      local_130 = local_148;
      local_128 = local_140;
      CallConv::setPreservedRegs((CallConv *)CONCAT44(in_stack_fffffffffffff49c,uVar7),RVar6,RVar5);
    }
  }
  cc->_id = ccId_local;
  return 0;
}

Assistant:

ASMJIT_FAVOR_SIZE Error initCallConv(CallConv& cc, CallConvId ccId, const Environment& environment) noexcept {
  constexpr uint32_t kZax = Gp::kIdAx;
  constexpr uint32_t kZbx = Gp::kIdBx;
  constexpr uint32_t kZcx = Gp::kIdCx;
  constexpr uint32_t kZdx = Gp::kIdDx;
  constexpr uint32_t kZsp = Gp::kIdSp;
  constexpr uint32_t kZbp = Gp::kIdBp;
  constexpr uint32_t kZsi = Gp::kIdSi;
  constexpr uint32_t kZdi = Gp::kIdDi;

  bool winABI = environment.isPlatformWindows() || environment.isMSVC();

  cc.setArch(environment.arch());
  cc.setSaveRestoreRegSize(RegGroup::kVec, 16);
  cc.setSaveRestoreRegSize(RegGroup::kX86_MM, 8);
  cc.setSaveRestoreRegSize(RegGroup::kX86_K, 8);
  cc.setSaveRestoreAlignment(RegGroup::kVec, 16);
  cc.setSaveRestoreAlignment(RegGroup::kX86_MM, 8);
  cc.setSaveRestoreAlignment(RegGroup::kX86_K, 8);

  if (environment.is32Bit()) {
    bool isStandardCallConv = true;

    cc.setSaveRestoreRegSize(RegGroup::kGp, 4);
    cc.setSaveRestoreAlignment(RegGroup::kGp, 4);

    cc.setPreservedRegs(RegGroup::kGp, Support::bitMask(Gp::kIdBx, Gp::kIdSp, Gp::kIdBp, Gp::kIdSi, Gp::kIdDi));
    cc.setNaturalStackAlignment(4);

    switch (ccId) {
      case CallConvId::kCDecl:
        break;

      case CallConvId::kStdCall:
        cc.setFlags(CallConvFlags::kCalleePopsStack);
        break;

      case CallConvId::kFastCall:
        cc.setFlags(CallConvFlags::kCalleePopsStack);
        cc.setPassedOrder(RegGroup::kGp, kZcx, kZdx);
        break;

      case CallConvId::kVectorCall:
        cc.setFlags(CallConvFlags::kCalleePopsStack);
        cc.setPassedOrder(RegGroup::kGp, kZcx, kZdx);
        cc.setPassedOrder(RegGroup::kVec, 0, 1, 2, 3, 4, 5);
        break;

      case CallConvId::kThisCall:
        // NOTE: Even MINGW (starting with GCC 4.7.0) now uses __thiscall on MS Windows, so we won't bail to any
        // other calling convention if __thiscall was specified.
        if (winABI) {
          cc.setFlags(CallConvFlags::kCalleePopsStack);
          cc.setPassedOrder(RegGroup::kGp, kZcx);
        }
        else {
          ccId = CallConvId::kCDecl;
        }
        break;

      case CallConvId::kRegParm1:
        cc.setPassedOrder(RegGroup::kGp, kZax);
        break;

      case CallConvId::kRegParm2:
        cc.setPassedOrder(RegGroup::kGp, kZax, kZdx);
        break;

      case CallConvId::kRegParm3:
        cc.setPassedOrder(RegGroup::kGp, kZax, kZdx, kZcx);
        break;

      case CallConvId::kLightCall2:
      case CallConvId::kLightCall3:
      case CallConvId::kLightCall4: {
        uint32_t n = uint32_t(ccId) - uint32_t(CallConvId::kLightCall2) + 2;

        cc.setFlags(CallConvFlags::kPassFloatsByVec);
        cc.setPassedOrder(RegGroup::kGp, kZax, kZdx, kZcx, kZsi, kZdi);
        cc.setPassedOrder(RegGroup::kVec, 0, 1, 2, 3, 4, 5, 6, 7);
        cc.setPassedOrder(RegGroup::kX86_K, 0, 1, 2, 3, 4, 5, 6, 7);
        cc.setPassedOrder(RegGroup::kX86_MM, 0, 1, 2, 3, 4, 5, 6, 7);
        cc.setPreservedRegs(RegGroup::kGp, Support::lsbMask<uint32_t>(8));
        cc.setPreservedRegs(RegGroup::kVec, Support::lsbMask<uint32_t>(8) & ~Support::lsbMask<uint32_t>(n));

        cc.setNaturalStackAlignment(16);
        isStandardCallConv = false;
        break;
      }

      default:
        return DebugUtils::errored(kErrorInvalidArgument);
    }

    if (isStandardCallConv) {
      // MMX arguments is something where compiler vendors disagree. For example GCC and MSVC would pass first three
      // via registers and the rest via stack, however Clang passes all via stack. Returning MMX registers is even
      // more fun, where GCC uses MM0, but Clang uses EAX:EDX pair. I'm not sure it's something we should be worried
      // about as MMX is deprecated anyway.
      cc.setPassedOrder(RegGroup::kX86_MM, 0, 1, 2);

      // Vector arguments (XMM|YMM|ZMM) are passed via registers. However, if the function is variadic then they have
      // to be passed via stack.
      cc.setPassedOrder(RegGroup::kVec, 0, 1, 2);

      // Functions with variable arguments always use stack for MM and vector arguments.
      cc.addFlags(CallConvFlags::kPassVecByStackIfVA);
    }

    if (ccId == CallConvId::kCDecl) {
      cc.addFlags(CallConvFlags::kVarArgCompatible);
    }
  }
  else {
    cc.setSaveRestoreRegSize(RegGroup::kGp, 8);
    cc.setSaveRestoreAlignment(RegGroup::kGp, 8);

    // Preprocess the calling convention into a common id as many conventions are normally ignored even by C/C++
    // compilers and treated as `__cdecl`.
    if (shouldTreatAsCDeclIn64BitMode(ccId))
      ccId = winABI ? CallConvId::kX64Windows : CallConvId::kX64SystemV;

    switch (ccId) {
      case CallConvId::kX64SystemV: {
        cc.setFlags(CallConvFlags::kPassFloatsByVec |
                    CallConvFlags::kPassMmxByXmm    |
                    CallConvFlags::kVarArgCompatible);
        cc.setNaturalStackAlignment(16);
        cc.setRedZoneSize(128);
        cc.setPassedOrder(RegGroup::kGp, kZdi, kZsi, kZdx, kZcx, 8, 9);
        cc.setPassedOrder(RegGroup::kVec, 0, 1, 2, 3, 4, 5, 6, 7);
        cc.setPreservedRegs(RegGroup::kGp, Support::bitMask(kZbx, kZsp, kZbp, 12, 13, 14, 15));
        break;
      }

      case CallConvId::kX64Windows: {
        cc.setStrategy(CallConvStrategy::kX64Windows);
        cc.setFlags(CallConvFlags::kPassFloatsByVec |
                    CallConvFlags::kIndirectVecArgs |
                    CallConvFlags::kPassMmxByGp     |
                    CallConvFlags::kVarArgCompatible);
        cc.setNaturalStackAlignment(16);
        // Maximum 4 arguments in registers, each adds 8 bytes to the spill zone.
        cc.setSpillZoneSize(4 * 8);
        cc.setPassedOrder(RegGroup::kGp, kZcx, kZdx, 8, 9);
        cc.setPassedOrder(RegGroup::kVec, 0, 1, 2, 3);
        cc.setPreservedRegs(RegGroup::kGp, Support::bitMask(kZbx, kZsp, kZbp, kZsi, kZdi, 12, 13, 14, 15));
        cc.setPreservedRegs(RegGroup::kVec, Support::bitMask(6, 7, 8, 9, 10, 11, 12, 13, 14, 15));
        break;
      }

      case CallConvId::kVectorCall: {
        cc.setStrategy(CallConvStrategy::kX64VectorCall);
        cc.setFlags(CallConvFlags::kPassFloatsByVec |
                    CallConvFlags::kPassMmxByGp     );
        cc.setNaturalStackAlignment(16);
        // Maximum 6 arguments in registers, each adds 8 bytes to the spill zone.
        cc.setSpillZoneSize(6 * 8);
        cc.setPassedOrder(RegGroup::kGp, kZcx, kZdx, 8, 9);
        cc.setPassedOrder(RegGroup::kVec, 0, 1, 2, 3, 4, 5);
        cc.setPreservedRegs(RegGroup::kGp, Support::bitMask(kZbx, kZsp, kZbp, kZsi, kZdi, 12, 13, 14, 15));
        cc.setPreservedRegs(RegGroup::kVec, Support::bitMask(6, 7, 8, 9, 10, 11, 12, 13, 14, 15));
        break;
      }

      case CallConvId::kLightCall2:
      case CallConvId::kLightCall3:
      case CallConvId::kLightCall4: {
        uint32_t n = uint32_t(ccId) - uint32_t(CallConvId::kLightCall2) + 2;

        cc.setFlags(CallConvFlags::kPassFloatsByVec);
        cc.setNaturalStackAlignment(16);
        cc.setPassedOrder(RegGroup::kGp, kZax, kZdx, kZcx, kZsi, kZdi);
        cc.setPassedOrder(RegGroup::kVec, 0, 1, 2, 3, 4, 5, 6, 7);
        cc.setPassedOrder(RegGroup::kX86_K, 0, 1, 2, 3, 4, 5, 6, 7);
        cc.setPassedOrder(RegGroup::kX86_MM, 0, 1, 2, 3, 4, 5, 6, 7);

        cc.setPreservedRegs(RegGroup::kGp, Support::lsbMask<uint32_t>(16));
        cc.setPreservedRegs(RegGroup::kVec, ~Support::lsbMask<uint32_t>(n));
        break;
      }

      default:
        return DebugUtils::errored(kErrorInvalidArgument);
    }
  }

  cc.setId(ccId);
  return kErrorOk;
}